

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_event_reader.hpp
# Opt level: O1

void __thiscall
jsoncons::msgpack::msgpack_event_reader<jsoncons::bytes_source,_std::allocator<char>_>::read_next
          (msgpack_event_reader<jsoncons::bytes_source,_std::allocator<char>_> *this,error_code *ec)

{
  if ((this->cursor_visitor_).state_ != 0) {
    basic_item_event_receiver<char>::send_available(&this->cursor_visitor_,ec);
    return;
  }
  (this->parser_).more_ = true;
  do {
    basic_msgpack_parser<jsoncons::bytes_source,_std::allocator<char>_>::parse
              (&this->parser_,&(this->cursor_visitor_).super_basic_item_event_visitor<char>,ec);
    if (ec->_M_value != 0) {
      return;
    }
  } while (((this->parser_).more_ & 1U) != 0);
  return;
}

Assistant:

void read_next(std::error_code& ec)
        {
            if (cursor_visitor_.in_available())
            {
                cursor_visitor_.send_available(ec);
            }
            else
            {
                parser_.restart();
                while (!parser_.stopped())
                {
                    parser_.parse(cursor_visitor_, ec);
                    if (JSONCONS_UNLIKELY(ec)) {return;}
                }
            }
        }